

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupTestMemoryAccountant::~TEST_GROUP_CppUTestGroupTestMemoryAccountant
          (TEST_GROUP_CppUTestGroupTestMemoryAccountant *this)

{
  TEST_GROUP_CppUTestGroupTestMemoryAccountant *this_local;
  
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupTestMemoryAccountant_0040f430;
  MemoryAccountantExecFunction::~MemoryAccountantExecFunction(&this->testFunction);
  TestTestingFixture::~TestTestingFixture(&this->fixture);
  MemoryAccountant::~MemoryAccountant(&this->accountant);
  Utest::~Utest(&this->super_Utest);
  return;
}

Assistant:

TEST_GROUP(TestMemoryAccountant)
{
    MemoryAccountant accountant;
    TestTestingFixture fixture;
    MemoryAccountantExecFunction testFunction;

    void setup() _override
    {
        testFunction.parameter_ = &accountant;
        fixture.setTestFunction(&testFunction);
    }

    void teardown() _override
    {
        accountant.clear();
    }
}